

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  shared_sstring_view *psVar1;
  undefined4 uVar2;
  element_type *this;
  bool bVar3;
  ostream *poVar4;
  value_reference_type ppVar5;
  indirect_string *this_00;
  uint uVar6;
  ulong uVar7;
  uint64_t uVar8;
  bool bVar9;
  undefined1 local_3e0 [8];
  shared_sstring_view owner;
  shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>_>
  strings;
  switches opt;
  not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*> local_360;
  not_null<const_pstore::sstring_view<const_char_*>_*> local_358;
  shared_ptr<const_char> ptr;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_268;
  raw_sstring_view local_260;
  raw_sstring_view str;
  database db;
  const_iterator it;
  
  local_3e0._0_4_ = 0;
  opt.db_path._M_dataplus._M_p = (pointer)&opt.db_path.field_2;
  opt.db_path._M_string_length = 0;
  opt.db_path.field_2._M_local_buf[0] = '\0';
  opt.key._M_dataplus._M_p = (pointer)&opt.key.field_2;
  opt.key._M_string_length = 0;
  opt.key.field_2._M_local_buf[0] = '\0';
  opt.revision = 0xffffffff;
  opt.string_mode = false;
  get_switches((pair<switches,_int> *)&db,argc,argv);
  it.it_.db_ = (database_reference)local_3e0;
  it.it_.visited_parents_.c_._M_elems[0].node.internal_ = (internal_node *)&opt;
  std::tuple<switches&,int&>::operator=((tuple<switches&,int&> *)&it,(pair<switches,_int> *)&db);
  switches::~switches((switches *)&db);
  uVar2 = local_3e0._0_4_;
  uVar6 = local_3e0._0_4_;
  if (local_3e0._0_4_ == 0) {
    pstore::database::database(&db,&opt.db_path,read_only,true);
    pstore::database::sync(&db);
    if (opt.string_mode == true) {
      pstore::index::
      get_index<(pstore::trailer::indices)3,pstore::database_const,pstore::index::hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>const>
                ((index *)&strings,&db,true);
      this = strings.
             super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
      bVar9 = strings.
              super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr == (element_type *)0x0;
      if (bVar9) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Strings index was not found");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        local_358.ptr_ = &str;
        str.ptr_ = opt.key._M_dataplus._M_p;
        str.size_ = opt.key._M_string_length;
        pstore::gsl::not_null<const_pstore::sstring_view<const_char_*>_*>::ensure_invariant
                  (&local_358);
        pstore::indirect_string::indirect_string((indirect_string *)&ptr,&db,local_358);
        pstore::index::
        hamt_set<pstore::indirect_string,pstore::index::fnv_64a_hash_indirect_string,std::equal_to<pstore::indirect_string>>
        ::find<pstore::indirect_string,void>(&it,this,&db,(indirect_string *)&ptr);
        pstore::index::
        hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
        ::cend((const_iterator *)&ptr,
               strings.
               super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr,&db);
        bVar3 = pstore::index::
                hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                ::iterator_base<true>::operator==(&it.it_,(iterator_base<true> *)&ptr);
        std::
        unique_ptr<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ::~unique_ptr((unique_ptr<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
                       *)&local_268);
        if (bVar3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&opt.key);
          poVar4 = std::operator<<(poVar4,": not found");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          owner.size_ = 0;
          this_00 = &pstore::index::
                     hamt_map<pstore::indirect_string,_pstore::index::details::empty_class,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>
                     ::iterator_base<true>::operator*(&it.it_)->first;
          local_360.ptr_ = &owner;
          pstore::gsl::not_null<pstore::sstring_view<std::shared_ptr<const_char>_>_*>::
          ensure_invariant(&local_360);
          local_260 = pstore::indirect_string::as_db_string_view(this_00,local_360);
          pstore::sstring_view<char_const*>::to_string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ptr,
                     (sstring_view<char_const*> *)&local_260,(allocator<char> *)(local_3e0 + 7));
          std::operator<<((ostream *)&std::cout,(string *)&ptr);
          std::__cxx11::string::~string((string *)&ptr);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
        }
        std::
        unique_ptr<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>,_std::default_delete<std::pair<const_pstore::indirect_string,_pstore::index::details::empty_class>_>_>
        ::~unique_ptr(&it.it_.pos_);
      }
      psVar1 = (shared_sstring_view *)&strings;
    }
    else {
      pstore::index::
      get_index<(pstore::trailer::indices)5,pstore::database_const,pstore::index::hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>const>
                ((index *)&owner,&db,true);
      bVar9 = owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0;
      if (bVar9) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Error: Names index was not found");
        std::endl<char,std::char_traits<char>>(poVar4);
      }
      else {
        pstore::index::
        hamt_map<std::__cxx11::string,pstore::extent<char>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>
        ::find<std::__cxx11::string,void>
                  ((const_iterator *)&it,
                   owner.ptr_.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&db,
                   &opt.key);
        memset(&ptr.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount,0,0xd8);
        local_268._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        ptr.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)&db;
        bVar3 = pstore::index::
                hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::iterator_base<true>::operator==
                          ((iterator_base<true> *)&it,(iterator_base<true> *)&ptr);
        std::
        unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                       *)&local_268);
        if (bVar3) {
          poVar4 = std::operator<<((ostream *)&std::cerr,(string *)&opt.key);
          poVar4 = std::operator<<(poVar4,": not found");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          ppVar5 = pstore::index::
                   hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::iterator_base<true>::operator*((iterator_base<true> *)&it);
          pstore::database::getro<char,void>((database *)&ptr,(extent<char> *)&db);
          std::ios::exceptions((int)*(undefined8 *)(std::cout + -0x18) + 0x13a298);
          uVar8 = (ppVar5->second).size;
          strings.
          super___shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = _stdout;
          pstore::gsl::not_null<_IO_FILE_*>::ensure_invariant((not_null<_IO_FILE_*> *)&strings);
          for (; uVar8 != 0; uVar8 = uVar8 - uVar7) {
            uVar7 = 0x7fffffffffffffff;
            if (uVar8 < 0x7fffffffffffffff) {
              uVar7 = uVar8;
            }
            std::ostream::write((char *)&std::cout,
                                (long)ptr.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&ptr.super___shared_ptr<const_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::
        unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
        ::~unique_ptr((unique_ptr<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>,_std::default_delete<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstore::extent<char>_>_>_>
                       *)&it.it_.pos_);
      }
      psVar1 = &owner;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&((__shared_ptr<const_pstore::index::hamt_set<pstore::indirect_string,_pstore::index::fnv_64a_hash_indirect_string,_std::equal_to<pstore::indirect_string>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)&psVar1->ptr_)->_M_refcount);
    local_3e0._0_4_ = ZEXT14(bVar9);
    pstore::database::~database(&db);
    uVar6 = 0;
  }
  switches::~switches(&opt);
  if (uVar2 == 0) {
    uVar6 = local_3e0._0_4_;
  }
  return uVar6;
}

Assistant:

int main (int argc, char * argv[]) {
#endif
    int exit_code = EXIT_SUCCESS;

    PSTORE_TRY {
        switches opt;
        std::tie (opt, exit_code) = get_switches (argc, argv);
        if (exit_code != EXIT_SUCCESS) {
            return exit_code;
        }

        pstore::database db{opt.db_path, pstore::database::access_mode::read_only};
        db.sync (opt.revision);

        bool const ok =
            opt.string_mode ? read_strings_index (db, opt.key) : read_names_index (db, opt.key);
        exit_code = ok ? EXIT_SUCCESS : EXIT_FAILURE;
    }